

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

Image * __thiscall Image::resized(Image *this,Size newSize)

{
  int *piVar1;
  Size in_RSI;
  Image *in_RDI;
  Image *newImage;
  Image *this_00;
  Size section;
  Image *in_stack_ffffffffffffffa0;
  Point point;
  undefined8 in_stack_ffffffffffffffa8;
  Size in_stack_ffffffffffffffb0;
  undefined1 local_3c [4];
  int iStack_38;
  undefined4 local_34;
  undefined4 uStack_30;
  undefined4 local_2c;
  undefined1 local_19;
  int local_10;
  int aiStack_c [3];
  
  local_19 = 0;
  local_2c = 0;
  this_00 = in_RDI;
  Image(in_stack_ffffffffffffffa0,in_stack_ffffffffffffffb0,
        SUB84((ulong)in_stack_ffffffffffffffa8 >> 0x20,0));
  local_34 = 0;
  uStack_30 = 0;
  point = (Point)local_3c;
  piVar1 = std::min<int>((int *)in_RSI,&local_10);
  section = in_RSI;
  *(int *)point = *piVar1;
  piVar1 = std::min<int>((int *)((long)in_RSI + 4),aiStack_c);
  iStack_38 = *piVar1;
  drawOnto(this_00,in_RDI,point,section);
  return this_00;
}

Assistant:

Image Image::resized(Size newSize) const {
	Image newImage(newSize);
	this->drawOnto(newImage, {0, 0}, {std::min(size.width, newSize.width), std::min(size.height, newSize.height)});
	return newImage;
}